

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O3

Variant * Jinx::operator/(Variant *__return_storage_ptr__,Variant *left,Variant *right)

{
  ValueType VVar1;
  ValueType VVar2;
  int64_t iVar3;
  int64_t iVar4;
  char *format;
  double dVar5;
  double dVar6;
  
  VVar1 = left->m_type;
  if (VVar1 - Number < 2) {
    VVar2 = right->m_type;
    if (VVar2 - Number < 2) {
      __return_storage_ptr__->m_type = Null;
      if (VVar2 == Integer && VVar1 == Integer) {
        iVar3 = Variant::GetInteger(left);
        iVar4 = Variant::GetInteger(right);
        if (iVar3 % iVar4 == 0) {
          Variant::Destroy(__return_storage_ptr__);
          __return_storage_ptr__->m_type = Integer;
          (__return_storage_ptr__->field_1).m_integer = iVar3 / iVar4;
          return __return_storage_ptr__;
        }
        dVar6 = (double)iVar3;
        dVar5 = (double)iVar4;
      }
      else {
        dVar6 = Variant::GetNumber(left);
        dVar5 = Variant::GetNumber(right);
      }
      Variant::Destroy(__return_storage_ptr__);
      __return_storage_ptr__->m_type = Number;
      (__return_storage_ptr__->field_1).m_number = dVar6 / dVar5;
      return __return_storage_ptr__;
    }
    format = "Invalid right operand for division";
  }
  else {
    format = "Invalid left operand for division";
  }
  Impl::LogWriteLine(Error,format);
  __return_storage_ptr__->m_type = Null;
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant operator / (const Variant & left, const Variant & right)
	{
		if (!left.IsNumericType())
		{
			Impl::LogWriteLine(LogLevel::Error, "Invalid left operand for division");
			return Variant();
		}
		if (!right.IsNumericType())
		{
			Impl::LogWriteLine(LogLevel::Error, "Invalid right operand for division");
			return Variant();
		}
		if (left.GetType() == ValueType::Integer && right.GetType() == ValueType::Integer)
		{
			Variant result;
			int64_t l = left.GetInteger();
			int64_t r = right.GetInteger();
			if (l % r == 0)
				result.SetInteger(l / r);
			else
				result.SetNumber(double(l) / (double)r);
			return result;
		}
		else
		{
			Variant result;
			result.SetNumber(left.GetNumber() / right.GetNumber());
			return result;
		}
	}